

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O2

int bitfield_check(nvamemtiming_conf *conf)

{
  FILE *__stream;
  color color;
  char outfile [21];
  
  snprintf(outfile,0x14,"entry_b_%i");
  __stream = fopen(outfile,"wb");
  if (__stream == (FILE *)0x0) {
    perror("Open the output file");
  }
  else {
    printf("Bitfield mode: test index %i\n",(ulong)(conf->field_4).manual.index);
    color = NO_COLOR;
    launch(conf,(FILE *)__stream,'\0',NO_COLOR);
    iterate_bitfield(conf,(FILE *)__stream,(conf->field_4).manual.index,color);
    fclose(__stream);
  }
  return (uint)(__stream == (FILE *)0x0);
}

Assistant:

int bitfield_check(struct nvamemtiming_conf *conf)
{
	char outfile[21];

	snprintf(outfile, 20, "entry_b_%i", conf->bitfield.index);

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(outfile, "wb");
	if (!outf) {
		perror("Open the output file");
		return 1;
	}

	printf("Bitfield mode: test index %i\n", conf->bitfield.index);

	launch(conf, outf, 0, NO_COLOR);
	iterate_bitfield(conf, outf, conf->bitfield.index, COLOR);

	fclose(outf);

	return 0;
}